

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  string *psVar1;
  MethodOptions *pMVar2;
  Symbol SVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long *)(method + 0x58) == 0) {
    pMVar2 = MethodOptions::default_instance();
    *(MethodOptions **)(method + 0x58) = pMVar2;
  }
  SVar3 = LookupSymbol(this,(proto->input_type_).ptr_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if (SVar3.type == MESSAGE) {
    internal::LazyDescriptor::Set((LazyDescriptor *)(method + 0x18),SVar3.field_1.descriptor);
  }
  else if (SVar3.type == NULL_SYMBOL) {
    psVar1 = (proto->input_type_).ptr_;
    if (this->pool_->lazily_build_dependencies_ == false) {
      AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,INPUT_TYPE,psVar1);
    }
    else {
      internal::LazyDescriptor::SetLazy((LazyDescriptor *)(method + 0x18),psVar1,this->file_);
    }
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",(proto->input_type_).ptr_);
    std::operator+(&bStack_68,&local_48,"\" is not a message type.");
    AddError(this,psVar1,&proto->super_Message,INPUT_TYPE,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  SVar3 = LookupSymbol(this,(proto->output_type_).ptr_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if (SVar3.type == MESSAGE) {
    internal::LazyDescriptor::Set((LazyDescriptor *)(method + 0x38),SVar3.field_1.descriptor);
  }
  else if (SVar3.type == NULL_SYMBOL) {
    psVar1 = (proto->output_type_).ptr_;
    if (this->pool_->lazily_build_dependencies_ == false) {
      AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,OUTPUT_TYPE,psVar1);
    }
    else {
      internal::LazyDescriptor::SetLazy((LazyDescriptor *)(method + 0x38),psVar1,this->file_);
    }
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",(proto->output_type_).ptr_);
    std::operator+(&bStack_68,&local_48,"\" is not a message type.");
    AddError(this,psVar1,&proto->super_Message,OUTPUT_TYPE,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(MethodDescriptor* method,
                                        const MethodDescriptorProto& proto) {
  if (method->options_ == nullptr) {
    method->options_ = &MethodOptions::default_instance();
  }

  Symbol input_type =
      LookupSymbol(proto.input_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (input_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::INPUT_TYPE,
                         proto.input_type());
    } else {
      method->input_type_.SetLazy(proto.input_type(), file_);
    }
  } else if (input_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE,
             "\"" + proto.input_type() + "\" is not a message type.");
  } else {
    method->input_type_.Set(input_type.descriptor);
  }

  Symbol output_type =
      LookupSymbol(proto.output_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (output_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                         proto.output_type());
    } else {
      method->output_type_.SetLazy(proto.output_type(), file_);
    }
  } else if (output_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE,
             "\"" + proto.output_type() + "\" is not a message type.");
  } else {
    method->output_type_.Set(output_type.descriptor);
  }
}